

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPTrap.h
# Opt level: O0

bool __thiscall SNMPTrap::sendTo(SNMPTrap *this,IPAddress *ip,bool skipBuild)

{
  ComplexType *pCVar1;
  UDP *this_00;
  int iVar2;
  size_t in_RCX;
  IPAddress local_5c0;
  int local_5ac;
  undefined1 local_5a8 [4];
  int length;
  uint8_t _packetBuffer [1400];
  bool local_22;
  bool buildStatus;
  bool skipBuild_local;
  IPAddress *ip_local;
  SNMPTrap *this_local;
  
  local_22 = true;
  if (!skipBuild) {
    local_22 = buildForSending(this);
  }
  if (this->_udp == (UDP *)0x0) {
    this_local._7_1_ = false;
  }
  else if ((this->super_SNMPPacket).packet == (ComplexType *)0x0) {
    this_local._7_1_ = false;
  }
  else if (local_22 == false) {
    this_local._7_1_ = false;
  }
  else {
    memset(local_5a8,0,0x578);
    pCVar1 = (this->super_SNMPPacket).packet;
    local_5ac = (*(pCVar1->super_BER_CONTAINER)._vptr_BER_CONTAINER[2])(pCVar1,local_5a8,0x578);
    if (local_5ac < 1) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = this->_udp;
      IPAddress::IPAddress(&local_5c0,ip);
      UDP::beginPacket(this_00,&local_5c0,this->trapUDPport);
      IPAddress::~IPAddress(&local_5c0);
      UDP::write(this->_udp,(int)local_5a8,(void *)(long)local_5ac,in_RCX);
      iVar2 = UDP::endPacket(this->_udp);
      this_local._7_1_ = iVar2 != 0;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool sendTo(const IPAddress& ip, bool skipBuild = false){
        bool buildStatus = true;
        if(!skipBuild) {
            buildStatus = this->buildForSending();
        }

        if(!_udp){
            return false;
        }

        if(!this->packet){
            return false;
        }

        if(!buildStatus){
            SNMP_LOGW("Failed Building packet..");
            return false;
        }

        uint8_t _packetBuffer[MAX_SNMP_PACKET_LENGTH] = {0};
        int length = packet->serialise(_packetBuffer, MAX_SNMP_PACKET_LENGTH);

        if(length <= 0) return false;

        _udp->beginPacket(ip, trapUDPport);
        _udp->write(_packetBuffer, length);
        return _udp->endPacket();
    }